

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O0

void set_title(char *title)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char local_218 [4];
  int err;
  char buffer [512];
  char *title_local;
  
  buffer._504_8_ = title;
  iVar1 = uv_get_process_title(local_218,0x200);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title.c"
            ,0x20,"err","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_set_process_title(buffer._504_8_);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title.c"
            ,0x23,"err","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_get_process_title(local_218,0x200);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title.c"
            ,0x26,"err","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = strcmp(local_218,(char *)buffer._504_8_);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title.c"
            ,0x28,"strcmp(buffer, title)","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void set_title(const char* title) {
  char buffer[512];
  int err;

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT_OK(err);

  err = uv_set_process_title(title);
  ASSERT_OK(err);

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT_OK(err);

  ASSERT_OK(strcmp(buffer, title));
}